

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

int xmlUTF8Strlen(xmlChar *utf)

{
  xmlChar xVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = -1;
  if (utf != (xmlChar *)0x0) {
    uVar3 = 0;
    while (xVar1 = *utf, xVar1 != '\0') {
      utf = utf + 1;
      if ((char)xVar1 < '\0') {
        return -1;
      }
      uVar3 = uVar3 + 1;
    }
    iVar2 = (int)uVar3;
    if (0x7fffffff < uVar3) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
xmlUTF8Strlen(const xmlChar *utf) {
    size_t ret = 0;

    if (utf == NULL)
        return(-1);

    while (*utf != 0) {
        if (utf[0] & 0x80) {
            if ((utf[1] & 0xc0) != 0x80)
                return(-1);
            if ((utf[0] & 0xe0) == 0xe0) {
                if ((utf[2] & 0xc0) != 0x80)
                    return(-1);
                if ((utf[0] & 0xf0) == 0xf0) {
                    if ((utf[0] & 0xf8) != 0xf0 || (utf[3] & 0xc0) != 0x80)
                        return(-1);
                    utf += 4;
                } else {
                    utf += 3;
                }
            } else {
                utf += 2;
            }
        } else {
            utf++;
        }
        ret++;
    }
    return(ret > INT_MAX ? 0 : ret);
}